

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

void xmlC14NFreeCtx(xmlC14NCtxPtr ctx)

{
  xmlC14NCtxPtr ctx_local;
  
  if (ctx == (xmlC14NCtxPtr)0x0) {
    xmlC14NErrParam("freeing context");
  }
  else {
    if (ctx->ns_rendered != (xmlC14NVisibleNsStackPtr)0x0) {
      xmlC14NVisibleNsStackDestroy(ctx->ns_rendered);
    }
    (*xmlFree)(ctx);
  }
  return;
}

Assistant:

static void
xmlC14NFreeCtx(xmlC14NCtxPtr ctx)
{
    if (ctx == NULL) {
        xmlC14NErrParam("freeing context");
        return;
    }

    if (ctx->ns_rendered != NULL) {
        xmlC14NVisibleNsStackDestroy(ctx->ns_rendered);
    }
    xmlFree(ctx);
}